

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall Fl_Text_Display::move_right(Fl_Text_Display *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Fl_Text_Buffer *this_00;
  int q;
  int p;
  Fl_Text_Display *this_local;
  
  iVar3 = this->mCursorPos;
  iVar2 = Fl_Text_Buffer::length(this->mBuffer);
  bVar1 = iVar3 < iVar2;
  if (bVar1) {
    iVar3 = insert_position(this);
    this_00 = buffer(this);
    iVar3 = Fl_Text_Buffer::next_char(this_00,iVar3);
    insert_position(this,iVar3);
  }
  this_local._4_4_ = (uint)bVar1;
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::move_right() {
  if ( mCursorPos >= mBuffer->length() )
    return 0;
  int p = insert_position();
  int q = buffer()->next_char(p);
  insert_position(q);
  return 1;
}